

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_IndexSpaceI.H
# Opt level: O0

void __thiscall
amrex::EB2::IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>::
IndexSpaceImp(IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_> *this,
             GeometryShop<amrex::EB2::ParserIF,_amrex::Parser> *gshop,Geometry *geom,
             int required_coarsening_level,int max_coarsening_level,int ngrow,
             bool build_coarse_level_by_coarsening,bool extend_domain_face,int num_coarsen_opt)

{
  long lVar1;
  undefined1 auVar2 [8];
  undefined4 uVar3;
  long lVar4;
  int *piVar5;
  reference pvVar6;
  reference pvVar7;
  string *msg;
  Level *this_00;
  int in_ECX;
  int iVar8;
  Geometry *in_RDX;
  IndexSpace *in_RDI;
  bool bVar9;
  byte in_stack_00000008;
  byte in_stack_00000010;
  int in_stack_00000018;
  Geometry cgeom;
  Box cdomain;
  int ng;
  bool coarsenable;
  int ilev;
  int i;
  int ngrow_finest;
  int dir;
  IntVect off;
  GeometryShop<amrex::EB2::ParserIF,_amrex::Parser> *in_stack_fffffffffffffb58;
  GeometryShop<amrex::EB2::ParserIF,_amrex::Parser> *in_stack_fffffffffffffb60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  value_type *in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb70;
  int in_stack_fffffffffffffb74;
  int in_stack_fffffffffffffb78;
  int in_stack_fffffffffffffb7c;
  int in_stack_fffffffffffffb80;
  int in_stack_fffffffffffffb84;
  int in_stack_fffffffffffffb88;
  int in_stack_fffffffffffffb8c;
  int in_stack_fffffffffffffb90;
  int in_stack_fffffffffffffb94;
  int in_stack_fffffffffffffb98;
  int in_stack_fffffffffffffb9c;
  vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>_>_>
  *in_stack_fffffffffffffba0;
  int in_stack_fffffffffffffbac;
  int in_stack_fffffffffffffbb0;
  int in_stack_fffffffffffffbb4;
  int in_stack_fffffffffffffbb8;
  int in_stack_fffffffffffffbbc;
  int local_440;
  int local_43c;
  int local_434;
  int local_430;
  int local_42c;
  int local_41c;
  int local_418;
  int local_414;
  int local_40c;
  int local_408;
  int local_404;
  int local_3fc;
  int local_3f8;
  int local_3f4;
  int local_3cc;
  undefined1 local_374 [44];
  string local_348 [192];
  char *in_stack_fffffffffffffd78;
  int in_stack_fffffffffffffd84;
  char *in_stack_fffffffffffffd88;
  char *in_stack_fffffffffffffd90;
  undefined8 local_258;
  undefined1 local_250 [8];
  undefined8 local_248;
  uint local_240;
  int local_23c;
  string local_238 [32];
  string local_218 [35];
  undefined1 local_1f5;
  int local_1f4;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  int local_1d8 [4];
  string local_1c6;
  undefined8 local_1a0;
  undefined4 local_194;
  char *local_190;
  char *local_188;
  IntVect local_180;
  undefined4 local_174;
  Box *local_170;
  int local_168;
  IntVect local_164;
  IntVect *local_158;
  undefined8 *local_150;
  int local_144;
  uint *local_140;
  int local_134;
  uint *local_130;
  int local_128;
  int local_124;
  IntVect *local_120;
  undefined4 local_114;
  IntVect *local_110;
  IntVect *local_108;
  undefined1 *local_100;
  undefined4 local_f4;
  IntVect *local_f0;
  undefined4 local_e4;
  IntVect *local_e0;
  undefined4 local_d4;
  IntVect *local_d0;
  IntVect *local_c8;
  undefined1 *local_c0;
  IntVect *local_b8;
  vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>_>_>
  *local_b0;
  IntVect *local_a8;
  undefined8 *local_a0;
  uint *local_98;
  int local_8c;
  undefined1 *local_88;
  undefined4 local_80;
  int local_7c;
  IntVect *local_78;
  int local_68;
  int local_64;
  int local_5c;
  int local_58;
  int local_50;
  int local_4c;
  int local_44;
  int local_40;
  int local_38;
  int local_34;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  int local_8;
  int local_4;
  
  local_1c6._1_1_ = in_stack_00000008 & 1;
  local_1c6._M_dataplus = (_Alloc_hider)(in_stack_00000010 & 1);
  local_1c6._M_string_length._2_4_ = in_ECX;
  local_1c6._14_8_ = in_RDX;
  IndexSpace::IndexSpace(in_RDI);
  in_RDI->_vptr_IndexSpace = (_func_int **)&PTR__IndexSpaceImp_01aa51e8;
  GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>::GeometryShop
            (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
  *(byte *)&in_RDI[4]._vptr_IndexSpace = local_1c6._1_1_ & 1;
  *(byte *)((long)&in_RDI[4]._vptr_IndexSpace + 1) = (byte)local_1c6._M_dataplus & 1;
  *(int *)((long)&in_RDI[4]._vptr_IndexSpace + 4) = in_stack_00000018;
  Vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>_>_>
  ::Vector((Vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>_>_>
            *)0x14839e4);
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::Vector
            ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)0x14839fd);
  Vector<amrex::Box,_std::allocator<amrex::Box>_>::Vector
            ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)0x1483a16);
  Vector<int,_std::allocator<int>_>::Vector((Vector<int,_std::allocator<int>_> *)0x1483a2f);
  if ((local_1c6._M_string_length._2_4_ < 0) || (0x1e < local_1c6._M_string_length._2_4_)) {
    local_188 = "required_coarsening_level >= 0 && required_coarsening_level <= 30";
    local_190 = 
    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/EB/AMReX_EB2_IndexSpaceI.H"
    ;
    local_194 = 0xe;
    local_1a0 = 0;
    Assert_host(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd84,
                in_stack_fffffffffffffd78);
  }
  piVar5 = std::max<int>((int *)((long)&local_1c6._M_string_length + 2),(int *)&local_1c6.field_0x6)
  ;
  local_1c6._6_4_ = *piVar5;
  local_1d8[0] = 0x1e;
  piVar5 = std::min<int>(local_1d8,(int *)&local_1c6.field_0x6);
  local_1c6._6_4_ = *piVar5;
  local_1e0 = 0;
  piVar5 = std::max<int>((int *)&local_1c6.field_0x2,&local_1e0);
  local_1dc = *piVar5;
  for (local_1e4 = 1; local_1e4 <= local_1c6._M_string_length._2_4_; local_1e4 = local_1e4 + 1) {
    local_1dc = local_1dc << 1;
  }
  std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::push_back
            ((vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
             CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),in_stack_fffffffffffffb68
            );
  Geometry::Domain((Geometry *)local_1c6._14_8_);
  std::vector<amrex::Box,_std::allocator<amrex::Box>_>::push_back
            ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)
             CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
             (value_type *)in_stack_fffffffffffffb68);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
             (value_type *)in_stack_fffffffffffffb68);
  std::
  vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>_>_>
  ::reserve((vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>_>_>
             *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
            CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stack0x00000018;
  msg = &local_1c6;
  std::
  vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,amrex::Parser>>,std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,amrex::Parser>>>>
  ::
  emplace_back<amrex::EB2::IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,amrex::Parser>>*,amrex::EB2::GeometryShop<amrex::EB2::ParserIF,amrex::Parser>const&,amrex::Geometry_const&,int&,int&,bool&,int&>
            (in_stack_fffffffffffffba0,
             (IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_> **)
             CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
             (GeometryShop<amrex::EB2::ParserIF,_amrex::Parser> *)
             CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
             (Geometry *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
             (int *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
             (int *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
             (bool *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
             (int *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
  local_1f4 = 1;
  do {
    if ((int)local_1c6._6_4_ < local_1f4) {
      return;
    }
    pvVar6 = std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::back
                       ((vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)__rhs);
    Geometry::Domain(pvVar6);
    local_1f5 = Box::coarsenable((Box *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80
                                                ),in_stack_fffffffffffffb7c,
                                 in_stack_fffffffffffffb78);
    if (!(bool)local_1f5) {
      if (local_1c6._M_string_length._2_4_ < local_1f4) {
        return;
      }
      std::__cxx11::to_string(in_stack_fffffffffffffbac);
      std::operator+((char *)in_stack_fffffffffffffb68,__rhs);
      Abort(msg);
      std::__cxx11::string::~string(local_218);
      std::__cxx11::string::~string(local_238);
    }
    if (local_1c6._M_string_length._2_4_ < local_1f4) {
      local_3cc = 0;
    }
    else {
      pvVar7 = std::vector<int,_std::allocator<int>_>::back
                         ((vector<int,_std::allocator<int>_> *)__rhs);
      local_3cc = *pvVar7 / 2;
    }
    local_23c = local_3cc;
    pvVar6 = std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::back
                       ((vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)__rhs);
    local_170 = Geometry::Domain(pvVar6);
    local_174 = 2;
    local_258 = *(long *)(local_170->smallend).vect;
    local_250 = *(undefined1 (*) [8])((local_170->smallend).vect + 2);
    local_248 = *(long *)((local_170->bigend).vect + 1);
    local_240 = (local_170->btype).itype;
    IntVect::IntVect(&local_180,2);
    lVar4 = local_248;
    auVar2 = local_250;
    lVar1 = local_258;
    local_150 = &local_258;
    local_158 = &local_180;
    local_114 = 1;
    bVar9 = true;
    if ((local_180.vect[0] == 1) && (bVar9 = true, local_180.vect[1] == 1)) {
      bVar9 = local_180.vect[2] != 1;
    }
    local_110 = local_158;
    if (bVar9) {
      local_50 = (int)local_258;
      local_4c = local_50;
      if (local_180.vect[0] != 1) {
        if (local_180.vect[0] == 2) {
          if ((int)local_258 < 0) {
            iVar8 = (int)local_258 + 1;
            if (iVar8 < 1) {
              iVar8 = -iVar8;
            }
            local_3f4 = -iVar8 / 2 + -1;
          }
          else {
            local_3f4 = (int)local_258 / 2;
          }
          local_4c = local_3f4;
        }
        else if (local_180.vect[0] == 4) {
          if ((int)local_258 < 0) {
            iVar8 = (int)local_258 + 1;
            if (iVar8 < 1) {
              iVar8 = -iVar8;
            }
            local_3f8 = -iVar8 / 4 + -1;
          }
          else {
            local_3f8 = (int)local_258 / 4;
          }
          local_4c = local_3f8;
        }
        else {
          if ((int)local_258 < 0) {
            iVar8 = (int)local_258 + 1;
            if (iVar8 < 1) {
              iVar8 = -iVar8;
            }
            local_3fc = -iVar8 / local_180.vect[0] + -1;
          }
          else {
            local_3fc = (int)local_258 / local_180.vect[0];
          }
          local_4c = local_3fc;
        }
      }
      local_5c = local_258._4_4_;
      local_258._0_4_ = local_4c;
      local_58 = local_5c;
      if (local_180.vect[1] != 1) {
        if (local_180.vect[1] == 2) {
          if (lVar1 < 0) {
            iVar8 = local_5c + 1;
            if (iVar8 < 1) {
              iVar8 = -iVar8;
            }
            local_404 = -iVar8 / 2 + -1;
          }
          else {
            local_404 = local_5c / 2;
          }
          local_58 = local_404;
        }
        else if (local_180.vect[1] == 4) {
          if (lVar1 < 0) {
            iVar8 = local_5c + 1;
            if (iVar8 < 1) {
              iVar8 = -iVar8;
            }
            local_408 = -iVar8 / 4 + -1;
          }
          else {
            local_408 = local_5c / 4;
          }
          local_58 = local_408;
        }
        else {
          if (lVar1 < 0) {
            iVar8 = local_5c + 1;
            if (iVar8 < 1) {
              iVar8 = -iVar8;
            }
            local_40c = -iVar8 / local_180.vect[1] + -1;
          }
          else {
            local_40c = local_5c / local_180.vect[1];
          }
          local_58 = local_40c;
        }
      }
      local_258._4_4_ = local_58;
      local_68 = local_250._0_4_;
      local_64 = local_68;
      if (local_180.vect[2] != 1) {
        if (local_180.vect[2] == 2) {
          if ((int)local_250._0_4_ < 0) {
            iVar8 = local_250._0_4_ + 1;
            if (iVar8 < 1) {
              iVar8 = -iVar8;
            }
            local_414 = -iVar8 / 2 + -1;
          }
          else {
            local_414 = (int)local_250._0_4_ / 2;
          }
          local_64 = local_414;
        }
        else if (local_180.vect[2] == 4) {
          if ((int)local_250._0_4_ < 0) {
            iVar8 = local_250._0_4_ + 1;
            if (iVar8 < 1) {
              iVar8 = -iVar8;
            }
            local_418 = -iVar8 / 4 + -1;
          }
          else {
            local_418 = (int)local_250._0_4_ / 4;
          }
          local_64 = local_418;
        }
        else {
          if ((int)local_250._0_4_ < 0) {
            iVar8 = local_250._0_4_ + 1;
            if (iVar8 < 1) {
              iVar8 = -iVar8;
            }
            local_41c = -iVar8 / local_180.vect[2] + -1;
          }
          else {
            local_41c = (int)local_250._0_4_ / local_180.vect[2];
          }
          local_64 = local_41c;
        }
      }
      uVar3 = local_250._4_4_;
      local_250._0_4_ = local_64;
      local_98 = &local_240;
      local_a8 = local_158;
      local_a0 = local_150;
      if (local_240 == 0) {
        in_stack_fffffffffffffba0 =
             (vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>_>_>
              *)(local_250 + 4);
        local_2c = uVar3;
        local_28 = local_2c;
        if (local_180.vect[0] != 1) {
          if (local_180.vect[0] == 2) {
            if ((long)auVar2 < 0) {
              iVar8 = uVar3 + 1;
              if (iVar8 < 1) {
                iVar8 = -iVar8;
              }
              in_stack_fffffffffffffb9c = -iVar8 / 2 + -1;
              local_28 = in_stack_fffffffffffffb9c;
            }
            else {
              in_stack_fffffffffffffb9c = (int)uVar3 / 2;
              local_28 = in_stack_fffffffffffffb9c;
            }
          }
          else if (local_180.vect[0] == 4) {
            if ((long)auVar2 < 0) {
              iVar8 = uVar3 + 1;
              if (iVar8 < 1) {
                iVar8 = -iVar8;
              }
              in_stack_fffffffffffffb98 = -iVar8 / 4 + -1;
              local_28 = in_stack_fffffffffffffb98;
            }
            else {
              in_stack_fffffffffffffb98 = (int)uVar3 / 4;
              local_28 = in_stack_fffffffffffffb98;
            }
          }
          else if ((long)auVar2 < 0) {
            iVar8 = uVar3 + 1;
            if (iVar8 < 1) {
              iVar8 = -iVar8;
            }
            in_stack_fffffffffffffb94 = -iVar8 / local_180.vect[0] + -1;
            local_28 = in_stack_fffffffffffffb94;
          }
          else {
            in_stack_fffffffffffffb94 = (int)uVar3 / local_180.vect[0];
            local_28 = in_stack_fffffffffffffb94;
          }
        }
        local_250._4_4_ = local_28;
        local_38 = (int)local_248;
        local_34 = local_38;
        if (local_180.vect[1] != 1) {
          if (local_180.vect[1] == 2) {
            if ((int)local_248 < 0) {
              iVar8 = (int)local_248 + 1;
              if (iVar8 < 1) {
                iVar8 = -iVar8;
              }
              in_stack_fffffffffffffb8c = -iVar8 / 2 + -1;
              local_34 = in_stack_fffffffffffffb8c;
            }
            else {
              in_stack_fffffffffffffb8c = (int)local_248 / 2;
              local_34 = in_stack_fffffffffffffb8c;
            }
          }
          else if (local_180.vect[1] == 4) {
            if ((int)local_248 < 0) {
              iVar8 = (int)local_248 + 1;
              if (iVar8 < 1) {
                iVar8 = -iVar8;
              }
              in_stack_fffffffffffffb88 = -iVar8 / 4 + -1;
              local_34 = in_stack_fffffffffffffb88;
            }
            else {
              in_stack_fffffffffffffb88 = (int)local_248 / 4;
              local_34 = in_stack_fffffffffffffb88;
            }
          }
          else if ((int)local_248 < 0) {
            iVar8 = (int)local_248 + 1;
            if (iVar8 < 1) {
              iVar8 = -iVar8;
            }
            in_stack_fffffffffffffb84 = -iVar8 / local_180.vect[1] + -1;
            local_34 = in_stack_fffffffffffffb84;
          }
          else {
            in_stack_fffffffffffffb84 = (int)local_248 / local_180.vect[1];
            local_34 = in_stack_fffffffffffffb84;
          }
        }
        local_44 = local_248._4_4_;
        local_248._0_4_ = local_34;
        local_40 = local_44;
        if (local_180.vect[2] != 1) {
          if (local_180.vect[2] == 2) {
            if (lVar4 < 0) {
              iVar8 = local_44 + 1;
              if (iVar8 < 1) {
                iVar8 = -iVar8;
              }
              in_stack_fffffffffffffb7c = -iVar8 / 2 + -1;
              local_40 = in_stack_fffffffffffffb7c;
            }
            else {
              in_stack_fffffffffffffb7c = local_44 / 2;
              local_40 = in_stack_fffffffffffffb7c;
            }
          }
          else if (local_180.vect[2] == 4) {
            if (lVar4 < 0) {
              iVar8 = local_44 + 1;
              if (iVar8 < 1) {
                iVar8 = -iVar8;
              }
              in_stack_fffffffffffffb78 = -iVar8 / 4 + -1;
              local_40 = in_stack_fffffffffffffb78;
            }
            else {
              in_stack_fffffffffffffb78 = local_44 / 4;
              local_40 = in_stack_fffffffffffffb78;
            }
          }
          else if (lVar4 < 0) {
            iVar8 = local_44 + 1;
            if (iVar8 < 1) {
              iVar8 = -iVar8;
            }
            in_stack_fffffffffffffb74 = -iVar8 / local_180.vect[2] + -1;
            local_40 = in_stack_fffffffffffffb74;
          }
          else {
            in_stack_fffffffffffffb74 = local_44 / local_180.vect[2];
            local_40 = in_stack_fffffffffffffb74;
          }
        }
        local_248._4_4_ = local_40;
        in_stack_fffffffffffffb80 = local_180.vect[2];
        in_stack_fffffffffffffb90 = local_180.vect[1];
        local_b8 = local_158;
        local_b0 = in_stack_fffffffffffffba0;
      }
      else {
        IntVect::IntVect(&local_164,0);
        lVar1 = local_248;
        for (local_168 = 0; local_168 < 3; local_168 = local_168 + 1) {
          local_140 = &local_240;
          local_144 = local_168;
          local_134 = local_168;
          local_128 = local_168;
          if ((local_240 & 1 << ((byte)local_168 & 0x1f)) != 0) {
            local_88 = local_250 + 4;
            local_8c = local_168;
            local_120 = local_158;
            local_124 = local_168;
            if (*(int *)(local_88 + (long)local_168 * 4) % local_158->vect[local_168] != 0) {
              local_78 = &local_164;
              local_7c = local_168;
              local_80 = 1;
              local_78->vect[local_168] = 1;
            }
          }
          local_130 = local_140;
        }
        local_c0 = local_250 + 4;
        local_c8 = local_158;
        local_8 = local_250._4_4_;
        local_c = local_158->vect[0];
        local_4 = local_8;
        if (local_c != 1) {
          if (local_c == 2) {
            if ((long)local_250 < 0) {
              iVar8 = local_250._4_4_ + 1;
              if (iVar8 < 1) {
                iVar8 = -iVar8;
              }
              local_42c = -iVar8 / 2 + -1;
            }
            else {
              local_42c = (int)local_250._4_4_ / 2;
            }
            local_4 = local_42c;
          }
          else if (local_c == 4) {
            if ((long)local_250 < 0) {
              iVar8 = local_250._4_4_ + 1;
              if (iVar8 < 1) {
                iVar8 = -iVar8;
              }
              local_430 = -iVar8 / 4 + -1;
            }
            else {
              local_430 = (int)local_250._4_4_ / 4;
            }
            local_4 = local_430;
          }
          else {
            if ((long)local_250 < 0) {
              iVar8 = local_250._4_4_ + 1;
              if (iVar8 < 1) {
                iVar8 = -iVar8;
              }
              local_434 = -iVar8 / local_c + -1;
            }
            else {
              local_434 = (int)local_250._4_4_ / local_c;
            }
            local_4 = local_434;
          }
        }
        local_250._4_4_ = local_4;
        local_14 = (int)local_248;
        local_18 = local_158->vect[1];
        local_10 = local_14;
        if (local_18 != 1) {
          if (local_18 == 2) {
            if ((int)local_248 < 0) {
              iVar8 = (int)local_248 + 1;
              if (iVar8 < 1) {
                iVar8 = -iVar8;
              }
              local_43c = -iVar8 / 2 + -1;
            }
            else {
              local_43c = (int)local_248 / 2;
            }
            local_10 = local_43c;
          }
          else if (local_18 == 4) {
            if ((int)local_248 < 0) {
              iVar8 = (int)local_248 + 1;
              if (iVar8 < 1) {
                iVar8 = -iVar8;
              }
              local_440 = -iVar8 / 4 + -1;
            }
            else {
              local_440 = (int)local_248 / 4;
            }
            local_10 = local_440;
          }
          else if ((int)local_248 < 0) {
            iVar8 = (int)local_248 + 1;
            if (iVar8 < 1) {
              iVar8 = -iVar8;
            }
            in_stack_fffffffffffffbbc = -iVar8 / local_18 + -1;
            local_10 = in_stack_fffffffffffffbbc;
          }
          else {
            in_stack_fffffffffffffbbc = (int)local_248 / local_18;
            local_10 = in_stack_fffffffffffffbbc;
          }
        }
        local_20 = local_248._4_4_;
        local_248._0_4_ = local_10;
        in_stack_fffffffffffffbb8 = local_158->vect[2];
        local_1c = local_20;
        if (in_stack_fffffffffffffbb8 != 1) {
          if (in_stack_fffffffffffffbb8 == 2) {
            if (lVar1 < 0) {
              iVar8 = local_20 + 1;
              if (iVar8 < 1) {
                iVar8 = -iVar8;
              }
              in_stack_fffffffffffffbb4 = -iVar8 / 2 + -1;
              local_1c = in_stack_fffffffffffffbb4;
            }
            else {
              in_stack_fffffffffffffbb4 = local_20 / 2;
              local_1c = in_stack_fffffffffffffbb4;
            }
          }
          else if (in_stack_fffffffffffffbb8 == 4) {
            if (lVar1 < 0) {
              iVar8 = local_20 + 1;
              if (iVar8 < 1) {
                iVar8 = -iVar8;
              }
              in_stack_fffffffffffffbb0 = -iVar8 / 4 + -1;
              local_1c = in_stack_fffffffffffffbb0;
            }
            else {
              in_stack_fffffffffffffbb0 = local_20 / 4;
              local_1c = in_stack_fffffffffffffbb0;
            }
          }
          else if (lVar1 < 0) {
            iVar8 = local_20 + 1;
            if (iVar8 < 1) {
              iVar8 = -iVar8;
            }
            in_stack_fffffffffffffbac = -iVar8 / in_stack_fffffffffffffbb8 + -1;
            local_1c = in_stack_fffffffffffffbac;
          }
          else {
            in_stack_fffffffffffffbac = local_20 / in_stack_fffffffffffffbb8;
            local_1c = in_stack_fffffffffffffbac;
          }
        }
        local_248._4_4_ = local_1c;
        local_100 = local_250 + 4;
        local_108 = &local_164;
        local_d4 = 0;
        local_250._4_4_ = local_164.vect[0] + local_250._4_4_;
        local_e4 = 1;
        iVar8 = local_248._4_4_;
        local_248._0_4_ = local_164.vect[1] + (int)local_248;
        local_f4 = 2;
        local_248._4_4_ = local_164.vect[2] + iVar8;
        local_f0 = local_108;
        local_e0 = local_108;
        local_d0 = local_108;
        local_24 = in_stack_fffffffffffffbb8;
      }
    }
    std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::back
              ((vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)__rhs);
    amrex::coarsen((Geometry *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                   in_stack_fffffffffffffb7c);
    in_stack_fffffffffffffb68 = (value_type *)(in_RDI + 5);
    msg = (string *)
          Vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>_>_>
          ::operator[]((Vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>_>_>
                        *)__rhs,(size_type)msg);
    std::
    vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,amrex::Parser>>,std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,amrex::Parser>>>>
    ::
    emplace_back<amrex::EB2::IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,amrex::Parser>>*,int&,int&,int&,amrex::Geometry&,amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,amrex::Parser>>&>
              (in_stack_fffffffffffffba0,
               (IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_> **)
               CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
               (int *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
               (int *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
               (int *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
               (Geometry *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
               (GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_> *)
               CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
    this_00 = &std::
               vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>_>_>
               ::back((vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>_>_>
                       *)__rhs)->super_Level;
    bVar9 = Level::isOK(this_00);
    if (!bVar9) {
      std::
      vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>_>_>
      ::pop_back((vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>_>_>
                  *)0x1484f45);
      if (local_1c6._M_string_length._2_4_ < local_1f4) {
        return;
      }
      if ((local_1c6._1_1_ & 1) == 0) {
        local_374._0_4_ = in_stack_00000018 - local_1f4;
        __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_374;
        msg = &local_1c6;
        std::
        vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,amrex::Parser>>,std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,amrex::Parser>>>>
        ::
        emplace_back<amrex::EB2::IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,amrex::Parser>>*,amrex::EB2::GeometryShop<amrex::EB2::ParserIF,amrex::Parser>const&,amrex::Geometry&,int&,int&,bool&,int>
                  (in_stack_fffffffffffffba0,
                   (IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_> **
                   )CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                   (GeometryShop<amrex::EB2::ParserIF,_amrex::Parser> *)
                   CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                   (Geometry *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                   (int *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                   (int *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                   (bool *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                   (int *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
      }
      else {
        std::__cxx11::to_string(in_stack_fffffffffffffbac);
        std::operator+((char *)in_stack_fffffffffffffb68,__rhs);
        Abort(msg);
        std::__cxx11::string::~string(local_348);
        std::__cxx11::string::~string((string *)(local_374 + 0xc));
      }
    }
    std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::push_back
              ((vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
               CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
               in_stack_fffffffffffffb68);
    std::vector<amrex::Box,_std::allocator<amrex::Box>_>::push_back
              ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)
               CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
               (value_type *)in_stack_fffffffffffffb68);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
               (value_type *)in_stack_fffffffffffffb68);
    local_1f4 = local_1f4 + 1;
  } while( true );
}

Assistant:

IndexSpaceImp<G>::IndexSpaceImp (const G& gshop, const Geometry& geom,
                                 int required_coarsening_level,
                                 int max_coarsening_level,
                                 int ngrow, bool build_coarse_level_by_coarsening,
                                 bool extend_domain_face, int num_coarsen_opt)
    : m_gshop(gshop),
      m_build_coarse_level_by_coarsening(build_coarse_level_by_coarsening),
      m_extend_domain_face(extend_domain_face),
      m_num_coarsen_opt(num_coarsen_opt)
{
    // build finest level (i.e., level 0) first
    AMREX_ALWAYS_ASSERT(required_coarsening_level >= 0 && required_coarsening_level <= 30);
    max_coarsening_level = std::max(required_coarsening_level,max_coarsening_level);
    max_coarsening_level = std::min(30,max_coarsening_level);

    int ngrow_finest = std::max(ngrow,0);
    for (int i = 1; i <= required_coarsening_level; ++i) {
        ngrow_finest *= 2;
    }

    m_geom.push_back(geom);
    m_domain.push_back(geom.Domain());
    m_ngrow.push_back(ngrow_finest);
    m_gslevel.reserve(max_coarsening_level+1);
    m_gslevel.emplace_back(this, gshop, geom, EB2::max_grid_size, ngrow_finest, extend_domain_face,
                           num_coarsen_opt);

    for (int ilev = 1; ilev <= max_coarsening_level; ++ilev)
    {
        bool coarsenable = m_geom.back().Domain().coarsenable(2,2);
        if (!coarsenable) {
            if (ilev <= required_coarsening_level) {
                amrex::Abort("IndexSpaceImp: domain is not coarsenable at level "+std::to_string(ilev));
            } else {
                break;
            }
        }

        int ng = (ilev > required_coarsening_level) ? 0 : m_ngrow.back()/2;

        Box cdomain = amrex::coarsen(m_geom.back().Domain(),2);
        Geometry cgeom = amrex::coarsen(m_geom.back(),2);
        m_gslevel.emplace_back(this, ilev, EB2::max_grid_size, ng, cgeom, m_gslevel[ilev-1]);
        if (!m_gslevel.back().isOK()) {
            m_gslevel.pop_back();
            if (ilev <= required_coarsening_level) {
                if (build_coarse_level_by_coarsening) {
                    amrex::Abort("Failed to build required coarse EB level "+std::to_string(ilev));
                } else {
                    m_gslevel.emplace_back(this, gshop, cgeom, EB2::max_grid_size, ng, extend_domain_face,
                                           num_coarsen_opt-ilev);
                }
            } else {
                break;
            }
        }
        m_geom.push_back(cgeom);
        m_domain.push_back(cdomain);
        m_ngrow.push_back(ng);
    }
}